

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O0

xmlParserInputPtr
xmlCtxtNewInputFromUrl
          (xmlParserCtxtPtr ctxt,char *url,char *publicId,char *encoding,xmlParserInputFlags flags)

{
  xmlParserInputPtr input;
  xmlParserInputFlags flags_local;
  char *encoding_local;
  char *publicId_local;
  char *url_local;
  xmlParserCtxtPtr ctxt_local;
  
  if ((ctxt == (xmlParserCtxtPtr)0x0) || (url == (char *)0x0)) {
    ctxt_local = (xmlParserCtxtPtr)0x0;
  }
  else {
    ctxt_local = (xmlParserCtxtPtr)xmlLoadResource(ctxt,url,publicId,XML_RESOURCE_MAIN_DOCUMENT);
    if (ctxt_local == (xmlParserCtxtPtr)0x0) {
      ctxt_local = (xmlParserCtxtPtr)0x0;
    }
    else if (encoding != (char *)0x0) {
      xmlSwitchInputEncodingName(ctxt,(xmlParserInputPtr)ctxt_local,encoding);
    }
  }
  return (xmlParserInputPtr)ctxt_local;
}

Assistant:

xmlParserInputPtr
xmlCtxtNewInputFromUrl(xmlParserCtxtPtr ctxt, const char *url,
                       const char *publicId, const char *encoding,
                       xmlParserInputFlags flags ATTRIBUTE_UNUSED) {
    xmlParserInputPtr input;

    if ((ctxt == NULL) || (url == NULL))
	return(NULL);

    input = xmlLoadResource(ctxt, url, publicId, XML_RESOURCE_MAIN_DOCUMENT);
    if (input == NULL)
        return(NULL);

    if (encoding != NULL)
        xmlSwitchInputEncodingName(ctxt, input, encoding);

    return(input);
}